

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

string * __thiscall
TransitionObservationIndependentMADPDiscrete::SoftPrintActionSets_abi_cxx11_
          (TransitionObservationIndependentMADPDiscrete *this)

{
  ostream *poVar1;
  undefined8 uVar2;
  ulong uVar3;
  void *this_00;
  ulong uVar4;
  long *in_RSI;
  string *in_RDI;
  ActionDiscrete *adp;
  Index actionI;
  Index agentIndex;
  stringstream ss;
  stringstream str;
  ostream *in_stack_fffffffffffffc18;
  TransitionObservationIndependentMADPDiscrete *in_stack_fffffffffffffc20;
  string local_360 [32];
  TransitionObservationIndependentMADPDiscrete *local_340;
  uint local_334;
  uint local_330;
  stringstream local_320 [16];
  ostream local_310 [376];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  if ((*(byte *)(in_RSI + 0x19) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_320);
    poVar1 = std::operator<<(local_310,"TransitionObservationIndependentMADPDiscrete::PrintAction");
    poVar1 = std::operator<<(poVar1,"Sets() - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E((E *)in_stack_fffffffffffffc20,(stringstream *)in_stack_fffffffffffffc18);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  poVar1 = std::operator<<(local_188,"Actions:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_330 = 0; (ulong)local_330 < (ulong)in_RSI[10]; local_330 = local_330 + 1) {
    poVar1 = std::operator<<(local_188,"agentI ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_330);
    poVar1 = std::operator<<(poVar1," - nrActions ");
    uVar3 = (**(code **)(*in_RSI + 0x48))(in_RSI,local_330);
    this_00 = (void *)std::ostream::operator<<(poVar1,uVar3);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_334 = 0;
    while( true ) {
      uVar3 = (ulong)local_334;
      uVar4 = (**(code **)(*in_RSI + 0x48))(in_RSI,local_330);
      if (uVar4 <= uVar3) break;
      GetIndividualMADPD(in_stack_fffffffffffffc20,(Index)((ulong)in_stack_fffffffffffffc18 >> 0x20)
                        );
      in_stack_fffffffffffffc20 =
           (TransitionObservationIndependentMADPDiscrete *)
           MultiAgentDecisionProcessDiscrete::GetActionDiscrete
                     ((MultiAgentDecisionProcessDiscrete *)in_stack_fffffffffffffc20,
                      (Index)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                      (Index)in_stack_fffffffffffffc18);
      in_stack_fffffffffffffc18 = local_188;
      local_340 = in_stack_fffffffffffffc20;
      (**(code **)(*(long *)&in_stack_fffffffffffffc20->super_MultiAgentDecisionProcess + 0x10))
                (local_360);
      std::operator<<(in_stack_fffffffffffffc18,local_360);
      std::__cxx11::string::~string(local_360);
      std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
      local_334 = local_334 + 1;
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string TransitionObservationIndependentMADPDiscrete::SoftPrintActionSets() const
{
    stringstream str;
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "TransitionObservationIndependentMADPDiscrete::PrintAction"<<
                "Sets() - Error: not initialized. "<<endl;
        throw E(ss);
    }    
    str << "Actions:"<<endl;
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        str << "agentI " << agentIndex << " - nrActions " << 
            GetNrActions(agentIndex)<<endl; 
        for(Index actionI=0; actionI < GetNrActions(agentIndex); actionI++)
        {

            const ActionDiscrete * adp = GetIndividualMADPD(agentIndex)->
                GetActionDiscrete(0, actionI);
            str << adp->SoftPrint();
            str << endl;
        }
    }
    return(str.str());
}